

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitRefCast(BinaryInstWriter *this,RefCast *curr)

{
  ulong uVar1;
  WasmBinaryWriter *this_00;
  Exactness exactness;
  HeapType type;
  undefined7 in_register_00000009;
  void *__buf;
  Type *this_01;
  LEB<unsigned_int,_unsigned_char> *this_02;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_21;
  
  local_21 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id;
  this_01 = &(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type;
  if (((uint)uVar1 & 3) != 2 || uVar1 < 7) {
    this_02 = &local_2c;
    local_2c.value = 0x16;
  }
  else {
    this_02 = &local_28;
    local_28.value = 0x17;
  }
  LEB<unsigned_int,_unsigned_char>::write
            (this_02,(int)this->o,__buf,CONCAT71(in_register_00000009,uVar1 < 7));
  this_00 = this->parent;
  type = wasm::Type::getHeapType(this_01);
  exactness = wasm::Type::getExactness(this_01);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefCast(RefCast* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->type.isNullable()) {
    o << U32LEB(BinaryConsts::RefCastNull);
  } else {
    o << U32LEB(BinaryConsts::RefCast);
  }
  parent.writeHeapType(curr->type.getHeapType(), curr->type.getExactness());
}